

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

void __thiscall
wallet::SQLiteDatabase::SQLiteDatabase
          (SQLiteDatabase *this,path *dir_path,path *file_path,DatabaseOptions *options,bool mock)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  char *__s;
  runtime_error *prVar4;
  char **args;
  uint uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  char *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  undefined8 local_70;
  unique_lock<std::mutex> local_68;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_WalletDatabase).m_refcount = (__atomic_base<int>)0x0;
  (this->super_WalletDatabase).nUpdateCounter = (__atomic_base<unsigned_int>)0x0;
  (this->super_WalletDatabase).nLastSeen = 0;
  (this->super_WalletDatabase).nLastFlushed = 0;
  (this->super_WalletDatabase).nLastWalletUpdate = 0;
  (this->super_WalletDatabase)._vptr_WalletDatabase = (_func_int **)&PTR__SQLiteDatabase_006c94b8;
  this->m_mock = mock;
  pcVar1 = (dir_path->super_path)._M_pathname._M_dataplus._M_p;
  sVar2 = (dir_path->super_path)._M_pathname._M_string_length;
  (this->m_dir_path)._M_dataplus._M_p = (pointer)&(this->m_dir_path).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_dir_path,pcVar1,pcVar1 + sVar2)
  ;
  pcVar1 = (file_path->super_path)._M_pathname._M_dataplus._M_p;
  sVar2 = (file_path->super_path)._M_pathname._M_string_length;
  (this->m_file_path)._M_dataplus._M_p = (pointer)&(this->m_file_path).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->m_file_path,pcVar1,pcVar1 + sVar2);
  std::condition_variable::condition_variable(&(this->m_write_semaphore).condition);
  (this->m_write_semaphore).mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->m_write_semaphore).mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_write_semaphore).mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_write_semaphore).mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_write_semaphore).mutex.super___mutex_base._M_mutex + 8) = 0;
  (this->m_write_semaphore).value = 1;
  this->m_db = (sqlite3 *)0x0;
  this->m_use_unsafe_sync = options->use_unsafe_sync;
  local_68._M_device = (mutex_type *)g_sqlite_mutex;
  local_68._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_68);
  __s = (char *)sqlite3_libversion();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,__s,(allocator<char> *)&local_70);
  source_file._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp";
  source_file._M_len = 0x5a;
  logging_function._M_str = "SQLiteDatabase";
  logging_function._M_len = 0xe;
  LogPrintf_<std::__cxx11::string>
            (logging_function,source_file,0x77,
             I2P|QT|LIBEVENT|MEMPOOLREJ|RAND|SELECTCOINS|ESTIMATEFEE|WALLETDB|MEMPOOL|TOR,
             (Level)&local_58,in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp";
  source_file_00._M_len = 0x5a;
  logging_function_00._M_str = "SQLiteDatabase";
  logging_function_00._M_len = 0xe;
  LogPrintf_<std::__cxx11::string>
            (logging_function_00,source_file_00,0x78,
             I2P|QT|LIBEVENT|MEMPOOLREJ|RAND|SELECTCOINS|ESTIMATEFEE|WALLETDB|BENCH|HTTP|MEMPOOL|TOR
             |NET,(Level)&this->m_dir_path,in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
  args = (char **)(ulong)g_sqlite_count;
  uVar5 = g_sqlite_count + 1;
  bVar6 = g_sqlite_count == 0;
  g_sqlite_count = uVar5;
  if (bVar6) {
    iVar3 = sqlite3_config(0x10,ErrorLogCallback,0);
    if (iVar3 != 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_70 = sqlite3_errstr(iVar3);
      tinyformat::format<char_const*>
                (&local_58,(tinyformat *)"SQLiteDatabase: Failed to setup error log: %s\n",
                 (char *)&local_70,args);
      std::runtime_error::runtime_error(prVar4,(string *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_001c5f66;
    }
    iVar3 = sqlite3_config(3);
    if (iVar3 != 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_70 = sqlite3_errstr(iVar3);
      tinyformat::format<char_const*>
                (&local_58,
                 (tinyformat *)"SQLiteDatabase: Failed to configure serialized threading mode: %s\n"
                 ,(char *)&local_70,args);
      std::runtime_error::runtime_error(prVar4,(string *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_001c5f66;
    }
  }
  iVar3 = sqlite3_initialize();
  if (iVar3 == 0) {
    std::unique_lock<std::mutex>::~unique_lock(&local_68);
    (*(this->super_WalletDatabase)._vptr_WalletDatabase[2])(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70 = sqlite3_errstr(iVar3);
    tinyformat::format<char_const*>
              (&local_58,(tinyformat *)"SQLiteDatabase: Failed to initialize SQLite: %s\n",
               (char *)&local_70,args);
    std::runtime_error::runtime_error(prVar4,(string *)&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_001c5f66:
  __stack_chk_fail();
}

Assistant:

SQLiteDatabase::SQLiteDatabase(const fs::path& dir_path, const fs::path& file_path, const DatabaseOptions& options, bool mock)
    : WalletDatabase(), m_mock(mock), m_dir_path(fs::PathToString(dir_path)), m_file_path(fs::PathToString(file_path)), m_write_semaphore(1), m_use_unsafe_sync(options.use_unsafe_sync)
{
    {
        LOCK(g_sqlite_mutex);
        LogPrintf("Using SQLite Version %s\n", SQLiteDatabaseVersion());
        LogPrintf("Using wallet %s\n", m_dir_path);

        if (++g_sqlite_count == 1) {
            // Setup logging
            int ret = sqlite3_config(SQLITE_CONFIG_LOG, ErrorLogCallback, nullptr);
            if (ret != SQLITE_OK) {
                throw std::runtime_error(strprintf("SQLiteDatabase: Failed to setup error log: %s\n", sqlite3_errstr(ret)));
            }
            // Force serialized threading mode
            ret = sqlite3_config(SQLITE_CONFIG_SERIALIZED);
            if (ret != SQLITE_OK) {
                throw std::runtime_error(strprintf("SQLiteDatabase: Failed to configure serialized threading mode: %s\n", sqlite3_errstr(ret)));
            }
        }
        int ret = sqlite3_initialize(); // This is a no-op if sqlite3 is already initialized
        if (ret != SQLITE_OK) {
            throw std::runtime_error(strprintf("SQLiteDatabase: Failed to initialize SQLite: %s\n", sqlite3_errstr(ret)));
        }
    }

    try {
        Open();
    } catch (const std::runtime_error&) {
        // If open fails, cleanup this object and rethrow the exception
        Cleanup();
        throw;
    }
}